

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

void Gia_ManAreCubeAddToTree_rec(Gia_ManAre_t *p,Gia_ObjAre_t *pObj,Gia_StaAre_t *pSta)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  Gia_PtrAre_t *pRoot;
  
  do {
    uVar2 = *(uint *)(&pSta[1].iPrev.field_0x0 + (*(uint *)pObj >> 2 & 0xffc));
    uVar3 = *(uint *)pObj * 2 & 0x1e;
    if ((uVar2 >> uVar3 & 1) == 0) {
      if ((uVar2 >> (sbyte)uVar3 & 2) == 0) {
        iVar1 = Gia_ObjHasBranch2(pObj);
        lVar4 = 0xc;
        if (iVar1 == 0) {
          pRoot = pObj->F + 2;
          Gia_ManAreCubeAddToList(p,pRoot,pSta);
          uVar2 = (*(uint *)pObj >> 0x1a) + 1;
          uVar3 = *(uint *)pObj & 0x3ffffff;
          *(uint *)pObj = uVar2 * 0x4000000 | uVar3;
          if ((~uVar2 & 0x3f) != 0) {
            return;
          }
          uVar2 = Gia_ManAreListCountListUsed(p,pObj->F[2]);
          *(uint *)pObj = uVar2 << 0x1a | uVar3;
          if (0x1e < (uVar2 & 0x3f)) {
            Gia_ManAreRebalance(p,pRoot);
            pObj->field_0x3 = pObj->field_0x3 & 3;
            return;
          }
          goto LAB_005c9987;
        }
      }
      else {
        iVar1 = Gia_ObjHasBranch1(pObj);
        lVar4 = 8;
        if (iVar1 == 0) {
          pRoot = pObj->F + 1;
          Gia_ManAreCubeAddToList(p,pRoot,pSta);
          uVar2 = (*(uint *)pObj >> 0x14) + 1 & 0x3f;
          uVar3 = *(uint *)pObj & 0xfc0fffff;
          *(uint *)pObj = uVar2 << 0x14 | uVar3;
          if (uVar2 != 0x3f) {
            return;
          }
          uVar2 = Gia_ManAreListCountListUsed(p,pObj->F[1]);
          *(uint *)pObj = (uVar2 & 0x3f) << 0x14 | uVar3;
          if (0x1e < (uVar2 & 0x3f)) {
            Gia_ManAreRebalance(p,pRoot);
            *(uint *)pObj = *(uint *)pObj & 0xfc0fffff;
            return;
          }
          goto LAB_005c9987;
        }
      }
    }
    else {
      iVar1 = Gia_ObjHasBranch0(pObj);
      lVar4 = 4;
      if (iVar1 == 0) {
        pRoot = pObj->F;
        Gia_ManAreCubeAddToList(p,pRoot,pSta);
        uVar2 = (*(uint *)pObj >> 0xe) + 1 & 0x3f;
        uVar3 = *(uint *)pObj & 0xfff03fff;
        *(uint *)pObj = uVar2 << 0xe | uVar3;
        if (uVar2 == 0x3f) {
          uVar2 = Gia_ManAreListCountListUsed(p,pObj->F[0]);
          *(uint *)pObj = (uVar2 & 0x3f) << 0xe | uVar3;
          if ((uVar2 & 0x3f) < 0x1f) {
LAB_005c9987:
            Gia_ManAreCompress(p,pRoot);
            return;
          }
          Gia_ManAreRebalance(p,pRoot);
          *(uint *)pObj = *(uint *)pObj & 0xfff03fff;
        }
        return;
      }
    }
    uVar2 = *(uint *)(&((Gia_ObjAre_t *)(pObj->F + -1))->field_0x0 + lVar4);
    pObj = (Gia_ObjAre_t *)
           ((ulong)((uVar2 & 0xfffff) << 4) +
           *(long *)((long)p->ppObjs + (ulong)(uVar2 >> 0x11 & 0x3ff8)));
  } while( true );
}

Assistant:

void Gia_ManAreCubeAddToTree_rec( Gia_ManAre_t * p, Gia_ObjAre_t * pObj, Gia_StaAre_t * pSta )
{
    if ( Gia_StaHasValue0(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch0(pObj) )
            Gia_ManAreCubeAddToTree_rec( p, Gia_ObjNextObj0(p, pObj), pSta );
        else
        {
            Gia_ManAreCubeAddToList( p, pObj->F, pSta );
            if ( ++pObj->nStas0 == MAX_CUBE_NUM )
            {
                pObj->nStas0 = Gia_ManAreListCountListUsed( p, pObj->F[0] );
                if ( pObj->nStas0 < MAX_CUBE_NUM/2 )
                    Gia_ManAreCompress( p, pObj->F );
                else
                {
                    Gia_ManAreRebalance( p, pObj->F );
                    pObj->nStas0 = 0;
                }
            }
        }
    }
    else if ( Gia_StaHasValue1(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch1(pObj) )
            Gia_ManAreCubeAddToTree_rec( p, Gia_ObjNextObj1(p, pObj), pSta );
        else
        {
            Gia_ManAreCubeAddToList( p, pObj->F+1, pSta );
            if ( ++pObj->nStas1 == MAX_CUBE_NUM )
            {
                pObj->nStas1 = Gia_ManAreListCountListUsed( p, pObj->F[1] );
                if ( pObj->nStas1 < MAX_CUBE_NUM/2 )
                    Gia_ManAreCompress( p, pObj->F+1 );
                else
                {
                    Gia_ManAreRebalance( p, pObj->F+1 );
                    pObj->nStas1 = 0;
                }
            }
        }
    }
    else
    {
        if ( Gia_ObjHasBranch2(pObj) )
            Gia_ManAreCubeAddToTree_rec( p, Gia_ObjNextObj2(p, pObj), pSta );
        else
        {
            Gia_ManAreCubeAddToList( p, pObj->F+2, pSta );
            if ( ++pObj->nStas2 == MAX_CUBE_NUM )
            {
                pObj->nStas2 = Gia_ManAreListCountListUsed( p, pObj->F[2] );
                if ( pObj->nStas2 < MAX_CUBE_NUM/2 )
                    Gia_ManAreCompress( p, pObj->F+2 );
                else
                {
                    Gia_ManAreRebalance( p, pObj->F+2 );
                    pObj->nStas2 = 0;
                }
            }
        }
    }
}